

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuda_finder.cpp
# Opt level: O2

path * __thiscall
CudaFinder::get_install_dir(path *__return_storage_ptr__,CudaFinder *this,path *path_)

{
  bool bVar1;
  __type _Var2;
  path *this_00;
  iterator __begin1;
  iterator __end1;
  iterator local_80;
  iterator local_68;
  string local_50;
  
  std::filesystem::__cxx11::path::path(__return_storage_ptr__);
  std::filesystem::__cxx11::path::begin(&local_80,path_);
  std::filesystem::__cxx11::path::end(&local_68,path_);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=(&local_80,&local_68);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    this_00 = local_80._M_path;
    if ((*(byte *)&((local_80._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      this_00 = (path *)local_80._M_cur;
    }
    std::filesystem::__cxx11::path::string(&local_50,this_00);
    _Var2 = std::operator==(&local_50,&this->m_target_version);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,this_00);
    if ((*(byte *)&((local_80._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      local_80._M_cur =
           (const_iterator)&(((path *)((long)local_80._M_cur + 0x28))->_M_pathname)._M_string_length
      ;
    }
    else {
      local_80._M_at_end = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path CudaFinder::get_install_dir(const fs::path &path_)
{
  fs::path o_path;
  for (auto &p : path_)
    if (p.string() == m_target_version)
      break;
    else
      o_path /= p;
  return o_path;
}